

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O0

void process_una(NMQ *q,uint32_t una)

{
  segment *s;
  dlnode *nxt;
  dlnode *node;
  uint32_t una_local;
  NMQ *q_local;
  
  nxt = (q->snd_buf).next;
  s = (segment *)nxt->next;
  while ((nxt != &q->snd_buf && (*(uint *)&nxt[2].next < una))) {
    process_ack(q,*(uint32_t *)&nxt[2].next,0);
    nxt = &s->head;
    s = (segment *)(s->head).next;
  }
  update_una(q);
  return;
}

Assistant:

static void process_una(NMQ *q, uint32_t una) {
    dlnode *node = 0, *nxt = 0;
    FOR_EACH(node, nxt, &q->snd_buf) {
        segment *s = ADDRESS_FOR(segment, head, node);
        if (s->sn < una) {
            process_ack(q, s->sn, 0);
        } else {
            break;
        }
    }

    update_una(q);
}